

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O3

Ret * __thiscall
axl::sl::Array<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>::
insertSpace(Array<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
            *this,size_t index,size_t count)

{
  Ret *pRVar1;
  ulong uVar2;
  bool bVar3;
  Ret *pRVar4;
  Ret *end;
  long lVar5;
  Ret *pRVar6;
  Ret *pRVar7;
  size_t sVar8;
  
  uVar2 = (this->
          super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
          ).m_count;
  bVar3 = setCountImpl<axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>::Construct>
                    (this,uVar2 + count);
  if (bVar3) {
    sVar8 = index;
    if (uVar2 < index) {
      sVar8 = uVar2;
    }
    pRVar7 = (this->
             super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
             ).m_p;
    pRVar4 = pRVar7 + sVar8;
    if (count != 0 && index < uVar2) {
      pRVar1 = pRVar4 + count;
      lVar5 = uVar2 - sVar8;
      if (((long)count < 0) || (pRVar7 + uVar2 <= pRVar1)) {
        if (0 < lVar5) {
          pRVar7 = pRVar4;
          do {
            sVar8 = pRVar7->m_originalRet;
            pRVar6 = pRVar7 + count;
            pRVar6->m_context = pRVar7->m_context;
            pRVar6->m_originalRet = sVar8;
            pRVar7 = pRVar7 + 1;
          } while (pRVar6 + 1 < pRVar1 + lVar5);
        }
      }
      else if (0 < lVar5) {
        pRVar6 = pRVar1 + lVar5;
        pRVar7 = pRVar7 + uVar2;
        do {
          sVar8 = pRVar7[-1].m_originalRet;
          pRVar6[-1].m_context = pRVar7[-1].m_context;
          pRVar6[-1].m_originalRet = sVar8;
          pRVar6 = pRVar6 + -1;
          pRVar7 = pRVar7 + -1;
        } while (pRVar1 < pRVar6);
      }
    }
  }
  else {
    pRVar4 = (Ret *)0x0;
  }
  return pRVar4;
}

Assistant:

T*
	insertSpace(
		size_t index,
		size_t count
	) {
		size_t oldCount = this->m_count;
		bool result = setCount(this->m_count + count);
		if (!result)
			return NULL;

		if (index > oldCount)
			index = oldCount;

		T* dst = this->m_p + index;

		if (count && index < oldCount)
			Details::copy(dst + count, dst, oldCount - index);

		return dst;
	}